

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Aig_Man_t * Llb_ReachableStates(Aig_Man_t *pAig)

{
  uint numVars;
  int iVar1;
  int iVar2;
  int iVar3;
  Llb_Mnx_t *p;
  int *Permute;
  DdManager *unique;
  DdNode *n;
  Vec_Ptr_t *pVVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  timespec ts_1;
  Gia_ParLlb_t Pars;
  timespec local_b0;
  Gia_ParLlb_t local_a0;
  
  iVar2 = clock_gettime(3,(timespec *)&local_a0);
  if (iVar2 < 0) {
    lVar8 = 1;
  }
  else {
    lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_a0.nHintDepth,local_a0.nClusterMax)),8);
    lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) +
            CONCAT44(local_a0.nIterMax,local_a0.nBddMax) * -1000000;
  }
  Llb_ManSetDefaultParams(&local_a0);
  local_a0.fSkipOutCheck = 1;
  local_a0.fCluster = 0;
  local_a0.fReorder = 0;
  local_a0.fSilent = 1;
  local_a0.nBddMax = 100;
  local_a0.nClusterMax = 500;
  p = Llb_MnxStart(pAig,&local_a0);
  iVar2 = Llb_Nonlin4Reachability(p);
  if (iVar2 != 1) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                  ,0x468,"Aig_Man_t *Llb_ReachableStates(Aig_Man_t *)");
  }
  iVar3 = Cudd_ReadSize(p->dd);
  iVar2 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar2 = iVar3;
  }
  if (iVar2 == 0) {
    Permute = (int *)0x0;
  }
  else {
    Permute = (int *)malloc((long)iVar2 << 2);
  }
  if (Permute != (int *)0x0) {
    memset(Permute,0xff,(long)iVar3 << 2);
  }
  numVars = pAig->nRegs;
  if (0 < (long)(int)numVars) {
    pVVar4 = pAig->vCis;
    iVar2 = pAig->nTruePis;
    lVar7 = (long)iVar2;
    lVar9 = 0;
    do {
      if ((iVar2 < 0) || (pVVar4->nSize <= lVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pVVar4->pArray[lVar7] + 0x24);
      if (((long)iVar1 < 0) || (p->vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vOrder->pArray[iVar1];
      if (((long)iVar1 < 0) || (iVar3 <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      Permute[iVar1] = (int)lVar9;
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 1;
    } while ((int)numVars != lVar9);
  }
  unique = Cudd_Init(numVars,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  n = Extra_TransferPermute(p->dd,unique,p->bReached,Permute);
  Cudd_Ref(n);
  if (Permute != (int *)0x0) {
    free(Permute);
  }
  iVar2 = Cudd_ReadSize(unique);
  if (iVar2 == pAig->nRegs) {
    iVar2 = clock_gettime(3,&local_b0);
    if (iVar2 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_b0.tv_nsec / 1000 + local_b0.tv_sec * 1000000;
    }
    p->timeTotal = lVar7 + lVar8;
    Llb_MnxStop(p);
    pVVar4 = Abc_NodeGetFakeNames(pAig->nRegs);
    pAVar5 = Abc_NtkDeriveFromBdd(unique,n,"reached",pVVar4);
    Abc_NodeFreeNames(pVVar4);
    Cudd_RecursiveDeref(unique,n);
    Cudd_Quit(unique);
    pNtk = Abc_NtkBddToMuxes(pAVar5,0,1000000);
    Abc_NtkDelete(pAVar5);
    pAVar5 = Abc_NtkStrash(pNtk,0,1,0);
    Abc_NtkDelete(pNtk);
    pAVar6 = Abc_NtkToDar(pAVar5,0,0);
    Abc_NtkDelete(pAVar5);
    return pAVar6;
  }
  __assert_fail("Cudd_ReadSize(dd) == Saig_ManRegNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb4Nonlin.c"
                ,0x479,"Aig_Man_t *Llb_ReachableStates(Aig_Man_t *)");
}

Assistant:

Aig_Man_t * Llb_ReachableStates( Aig_Man_t * pAig )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    Vec_Int_t * vPermute;
    Vec_Ptr_t * vNames;
    Gia_ParLlb_t Pars, * pPars = &Pars;
    DdManager * dd;
    DdNode * bReached;
    Llb_Mnx_t * pMnn;
    Abc_Ntk_t * pNtk, * pNtkMuxes;
    Aig_Obj_t * pObj;
    int i, RetValue;
    abctime clk = Abc_Clock();

    // create parameters
    Llb_ManSetDefaultParams( pPars );
    pPars->fSkipOutCheck = 1;
    pPars->fCluster      = 0;
    pPars->fReorder      = 0;
    pPars->fSilent       = 1;
    pPars->nBddMax       = 100;
    pPars->nClusterMax   = 500;

    // run reachability
    pMnn = Llb_MnxStart( pAig, pPars );
    RetValue = Llb_Nonlin4Reachability( pMnn );
    assert( RetValue == 1 );

    // print BDD
//    Extra_bddPrint( pMnn->dd, pMnn->bReached ); 
//    Extra_bddPrintSupport( pMnn->dd, pMnn->bReached ); 
//    printf( "\n" );

    // collect flop output variables
    vPermute = Vec_IntStartFull( Cudd_ReadSize(pMnn->dd) );
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntWriteEntry( vPermute, Llb_ObjBddVar(pMnn->vOrder, pObj), i );

    // transfer the reached state BDD into the new manager
    dd = Cudd_Init( Saig_ManRegNum(pAig), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    bReached = Extra_TransferPermute( pMnn->dd, dd, pMnn->bReached, Vec_IntArray(vPermute) );  Cudd_Ref( bReached );
    Vec_IntFree( vPermute );
    assert( Cudd_ReadSize(dd) == Saig_ManRegNum(pAig) );

    // quit reachability engine
    pMnn->timeTotal = Abc_Clock() - clk;
    Llb_MnxStop( pMnn );

    // derive the network
    vNames = Abc_NodeGetFakeNames( Saig_ManRegNum(pAig) );
    pNtk = Abc_NtkDeriveFromBdd( dd, bReached, "reached", vNames );
    Abc_NodeFreeNames( vNames );
    Cudd_RecursiveDeref( dd, bReached );
    Cudd_Quit( dd );

    // convert
    pNtkMuxes = Abc_NtkBddToMuxes( pNtk, 0, 1000000 );
    Abc_NtkDelete( pNtk );
    pNtk = Abc_NtkStrash( pNtkMuxes, 0, 1, 0 );
    Abc_NtkDelete( pNtkMuxes );
    pAig = Abc_NtkToDar( pNtk, 0, 0 );
    Abc_NtkDelete( pNtk );
    return pAig;
}